

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_QDBusConnectionPrivate::WatchedServiceData>_>::Data
          (Data<QHashPrivate::Node<QString,_QDBusConnectionPrivate::WatchedServiceData>_> *this,
          size_t reserve)

{
  size_t sVar1;
  size_t in_RDI;
  long in_FS_OFFSET;
  R_conflict6 RVar2;
  size_t in_stack_00000010;
  QBasicAtomicInteger<int> *in_stack_ffffffffffffffd0;
  QHashSeed local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QBasicAtomicInteger<int>::QBasicAtomicInteger(in_stack_ffffffffffffffd0,(int)(in_RDI >> 0x20));
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(undefined8 *)(in_RDI + 0x18) = 0;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  sVar1 = GrowthPolicy::bucketsForCapacity(in_RDI);
  *(size_t *)(in_RDI + 0x10) = sVar1;
  RVar2 = allocateSpans(in_stack_00000010);
  *(Span **)(in_RDI + 0x20) = RVar2.spans;
  local_10.data = QHashSeed::globalSeed();
  sVar1 = QHashSeed::operator_cast_to_unsigned_long(&local_10);
  *(size_t *)(in_RDI + 0x18) = sVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Data(size_t reserve = 0)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(reserve);
        spans = allocateSpans(numBuckets).spans;
        seed = QHashSeed::globalSeed();
    }